

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,FSoundID *sid,FSoundID *def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  char cVar4;
  int iVar5;
  Value *this;
  Ch *cc;
  char *pcVar6;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if (uVar1 != 0 && ((byte)(uVar1 >> 10) & 1) == 0) {
        __assert_fail("val->IsString() || val->IsNull()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x6f2,
                      "FSerializer &Serialize(FSerializer &, const char *, FSoundID &, FSoundID *)")
        ;
      }
      if ((uVar1 >> 10 & 1) == 0) {
        if (uVar1 != 0) {
          Printf("\x1cGstring type expected for \'%s\'",key);
          iVar5 = S_FindSound((char *)0x0);
          sid->ID = iVar5;
          arc->mErrors = arc->mErrors + 1;
          return arc;
        }
        pcVar6 = (char *)0x0;
      }
      else {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this);
        pcVar6 = UnicodeToString(cc);
      }
      iVar5 = S_FindSound(pcVar6);
      sid->ID = iVar5;
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if (uVar2 == 0) {
      cVar4 = '\0';
    }
    else {
      cVar4 = (pFVar3->mInObject).Array[uVar2 - 1];
    }
    if (((def == (FSoundID *)0x0) || (cVar4 == '\0')) || (sid->ID != def->ID)) {
      FSerializer::WriteKey(arc,key);
      if ((long)sid->ID == 0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = S_sfx.Array[sid->ID].name.Chars;
      }
      if (pcVar6 == (char *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::String(arc->w,pcVar6);
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FSoundID &sid, FSoundID *def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || sid != *def)
		{
			arc.WriteKey(key);
			const char *sn = (const char*)sid;
			if (sn != nullptr) arc.w->String(sn);
			else arc.w->Null();
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsString() || val->IsNull());
			if (val->IsString())
			{
				sid = UnicodeToString(val->GetString());
			}
			else if (val->IsNull())
			{
				sid = 0;
			}
			else
			{
				Printf(TEXTCOLOR_RED "string type expected for '%s'", key);
				sid = 0;
				arc.mErrors++;
			}
		}
	}
	return arc;

}